

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O1

void __thiscall
flatbuffers::swift::SwiftGenerator::GenTableWriterFields
          (SwiftGenerator *this,FieldDef *field,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *create_body,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *create_header)

{
  uint uVar1;
  Value *type_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  IdlNamer *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  CodeWriter *this_01;
  int *piVar4;
  BaseType BVar5;
  int iVar6;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_02;
  mapped_type *pmVar7;
  long *plVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  ulong *puVar11;
  long *plVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  undefined8 uVar16;
  _Alloc_hider _Var17;
  bool bVar18;
  string optional_enum;
  string default_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg_label;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string check_if_vector;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> body;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string nullable_type;
  string type;
  string builder_string;
  string field_var;
  string field_field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  key_type local_320;
  string local_300;
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0;
  long lStack_2c8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_2c0;
  string local_2b8;
  long *local_298 [2];
  long local_288 [2];
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  long *local_1f8 [2];
  long local_1e8 [2];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,", _ fbb: inout FlatBufferBuilder) { ","");
  this_00 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&local_218,this_00,field);
  (*(this_00->super_Namer)._vptr_Namer[7])(&local_238,this_00,field);
  type_00 = &field->value;
  GenType_abi_cxx11_(&local_278,this,&type_00->type,false);
  local_1d8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)create_body;
  if ((field->presence == kOptional) && ((type_00->type).base_type - BASE_TYPE_UTYPE < 0xc)) {
    local_298[0] = local_288;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_298,local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p + local_278._M_string_length);
    std::__cxx11::string::append((char *)local_298);
  }
  else {
    local_298[0] = local_288;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_298,local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p + local_278._M_string_length);
  }
  paVar3 = &local_320.field_2;
  local_320._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"FIELDVAR","");
  local_2c0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)create_header;
  (*(this_00->super_Namer)._vptr_Namer[7])(&local_300,this_00,field);
  this_01 = &this->code_;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_01->value_map_,&local_320);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar3) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  local_320._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"VALUETYPE","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_01->value_map_,&local_320);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar3) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  local_320._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"OFFSET","");
  (*(this_00->super_Namer)._vptr_Namer[0x12])(&local_300,this_00,field);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_01->value_map_,&local_320);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar3) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  local_320._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"CONSTANT","");
  SwiftConstant_abi_cxx11_(&local_300,this,field);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_01->value_map_,&local_320);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar3) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  BVar5 = (type_00->type).base_type;
  bVar18 = BVar5 - BASE_TYPE_ARRAY < 2;
  pcVar14 = "(";
  if (bVar18 || BVar5 == BASE_TYPE_VECTOR) {
    pcVar14 = "VectorOf(";
  }
  local_320._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,pcVar14,
             pcVar14 + (ulong)(bVar18 || BVar5 == BASE_TYPE_VECTOR) * 8 + 1);
  std::operator+(&local_3c0,"add",&local_320);
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_3c0,(ulong)local_218._M_dataplus._M_p);
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_380.field_2._M_allocated_capacity = *psVar10;
    local_380.field_2._8_8_ = plVar8[3];
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  }
  else {
    local_380.field_2._M_allocated_capacity = *psVar10;
    local_380._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_380._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_380);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_300.field_2._M_allocated_capacity = *psVar10;
    local_300.field_2._8_8_ = plVar8[3];
  }
  else {
    local_300.field_2._M_allocated_capacity = *psVar10;
    local_300._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_300._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_380,"{{ACCESS_TYPE}} static func ",&local_300);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_380);
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_f0.field_2._M_allocated_capacity = *psVar10;
    local_f0.field_2._8_8_ = plVar8[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar10;
    local_f0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_f0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  CodeWriter::operator+=(this_01,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_380.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != paVar3) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_3a0,"{{STRUCTNAME}}.",&local_300);
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_218._M_dataplus._M_p);
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  psVar10 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_3c0.field_2._M_allocated_capacity = *psVar10;
    local_3c0.field_2._8_8_ = puVar9[3];
  }
  else {
    local_3c0.field_2._M_allocated_capacity = *psVar10;
    local_3c0._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_3c0._M_string_length = puVar9[1];
  *puVar9 = psVar10;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_3c0);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_380.field_2._M_allocated_capacity = *puVar11;
    local_380.field_2._8_8_ = plVar8[3];
    local_380._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_380.field_2._M_allocated_capacity = *puVar11;
    local_380._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_380._M_string_length = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_1d8,&local_380);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != paVar3) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  BVar5 = (type_00->type).base_type;
  uVar1 = BVar5 - BASE_TYPE_UTYPE;
  if (BVar5 == BASE_TYPE_BOOL || 0xb < uVar1) {
    if (BVar5 != BASE_TYPE_STRUCT) {
      if (BVar5 != BASE_TYPE_BOOL) goto LAB_002f4be7;
      SwiftConstant_abi_cxx11_(&local_380,this,field);
      paVar3 = &local_3c0.field_2;
      local_3c0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"CONSTANT","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_01->value_map_,&local_3c0);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar3) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      local_3c0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"VALUETYPE","");
      bVar18 = field->presence == kOptional;
      pcVar14 = "Bool";
      if (bVar18) {
        pcVar14 = "Bool?";
      }
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3a0,pcVar14,pcVar14 + (ulong)bVar18 + 4);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_01->value_map_,&local_3c0);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar3) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_3c0,"{{VALUETYPE}}",&local_258);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_3c0);
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_150.field_2._M_allocated_capacity = *psVar10;
        local_150.field_2._8_8_ = plVar8[3];
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      }
      else {
        local_150.field_2._M_allocated_capacity = *psVar10;
        local_150._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_150._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      CodeWriter::operator+=(this_01,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar3) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      pcVar14 = " def: {{CONSTANT}},";
      if (field->presence == kOptional) {
        pcVar14 = "\\";
      }
      pcVar13 = pcVar14 + 0x13;
      if (field->presence == kOptional) {
        pcVar13 = pcVar14 + 1;
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar14,pcVar13);
      CodeWriter::operator+=(this_01,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0," at: {{TABLEOFFSET}}.{{OFFSET}}.p) }","");
      CodeWriter::operator+=(this_01,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_360,local_238._M_dataplus._M_p,
                 local_238._M_dataplus._M_p + local_238._M_string_length);
      std::__cxx11::string::append((char *)&local_360);
      plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_298[0]);
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_340.field_2._M_allocated_capacity = *psVar10;
        local_340.field_2._8_8_ = plVar8[3];
        local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      }
      else {
        local_340.field_2._M_allocated_capacity = *psVar10;
        local_340._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_340._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_340);
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      puVar11 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_3a0.field_2._M_allocated_capacity = *puVar11;
        local_3a0.field_2._8_8_ = plVar8[3];
      }
      else {
        local_3a0.field_2._M_allocated_capacity = *puVar11;
        local_3a0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_3a0._M_string_length = plVar8[1];
      *plVar8 = (long)puVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      local_2e0 = &local_2d0;
      if (field->presence == kOptional) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"nil","");
      }
      else {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_380._M_dataplus._M_p,
                   local_380._M_dataplus._M_p + local_380._M_string_length);
      }
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        uVar16 = local_3a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_2d8 + local_3a0._M_string_length) {
        uVar15 = 0xf;
        if (local_2e0 != &local_2d0) {
          uVar15 = local_2d0;
        }
        if (uVar15 < local_2d8 + local_3a0._M_string_length) goto LAB_002f5708;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_2e0,0,(char *)0x0,(ulong)local_3a0._M_dataplus._M_p);
      }
      else {
LAB_002f5708:
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_2e0);
      }
      psVar10 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_3c0.field_2._M_allocated_capacity = *psVar10;
        local_3c0.field_2._8_8_ = puVar9[3];
        local_3c0._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_3c0.field_2._M_allocated_capacity = *psVar10;
        local_3c0._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_3c0._M_string_length = puVar9[1];
      *puVar9 = psVar10;
      puVar9[1] = 0;
      *(undefined1 *)psVar10 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_2c0,&local_3c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar3) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      if (local_2e0 != &local_2d0) {
        operator_delete(local_2e0,local_2d0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      uVar16 = local_360.field_2._M_allocated_capacity;
      _Var17._M_p = local_360._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) goto LAB_002f5808;
      goto LAB_002f5810;
    }
    if (((field->value).type.struct_def)->fixed != true) {
LAB_002f4be7:
      (*(this_00->super_Namer)._vptr_Namer[7])(&local_3c0,this_00,field);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_3c0);
      puVar11 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_380.field_2._M_allocated_capacity = *puVar11;
        local_380.field_2._8_8_ = plVar8[3];
        local_380._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_380.field_2._M_allocated_capacity = *puVar11;
        local_380._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_380._M_string_length = plVar8[1];
      *plVar8 = (long)puVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      local_2e0 = &local_2d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e0,local_380._M_dataplus._M_p,
                 local_380._M_dataplus._M_p + local_380._M_string_length);
      std::__cxx11::string::append((char *)&local_2e0);
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_238._M_dataplus._M_p)
      ;
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      psVar10 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_360.field_2._M_allocated_capacity = *psVar10;
        local_360.field_2._8_8_ = puVar9[3];
      }
      else {
        local_360.field_2._M_allocated_capacity = *psVar10;
        local_360._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_360._M_string_length = puVar9[1];
      *puVar9 = psVar10;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_360);
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_340.field_2._M_allocated_capacity = *psVar10;
        local_340.field_2._8_8_ = plVar8[3];
      }
      else {
        local_340.field_2._M_allocated_capacity = *psVar10;
        local_340._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_340._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_340);
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      puVar11 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_3a0.field_2._M_allocated_capacity = *puVar11;
        local_3a0.field_2._8_8_ = plVar8[3];
      }
      else {
        local_3a0.field_2._M_allocated_capacity = *puVar11;
        local_3a0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_3a0._M_string_length = plVar8[1];
      *plVar8 = (long)puVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_3a0);
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_3c0.field_2._M_allocated_capacity = *psVar10;
        local_3c0.field_2._8_8_ = plVar8[3];
      }
      else {
        local_3c0.field_2._M_allocated_capacity = *psVar10;
        local_3c0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_3c0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_2c0,&local_3c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      if (local_2e0 != &local_2d0) {
        operator_delete(local_2e0,local_2d0 + 1);
      }
      std::operator+(&local_3a0,"Offset",&local_258);
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a0);
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      psVar10 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_3c0.field_2._M_allocated_capacity = *psVar10;
        local_3c0.field_2._8_8_ = puVar9[3];
      }
      else {
        local_3c0.field_2._M_allocated_capacity = *psVar10;
        local_3c0._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_3c0._M_string_length = puVar9[1];
      *puVar9 = psVar10;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_3c0);
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_190.field_2._M_allocated_capacity = *psVar10;
        local_190.field_2._8_8_ = plVar8[3];
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      }
      else {
        local_190.field_2._M_allocated_capacity = *psVar10;
        local_190._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_190._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      CodeWriter::operator+=(this_01,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      if (((((field->value).type.element == BASE_TYPE_STRUCT) &&
           (((field->value).type.struct_def)->fixed == true)) &&
          (BVar5 = (type_00->type).base_type, BVar5 < (BASE_TYPE_VECTOR64|BASE_TYPE_UTYPE))) &&
         ((0x64000U >> (BVar5 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) != 0)) {
        IdlNamer::NamespacedType_abi_cxx11_
                  (&local_3c0,this_00,&((field->value).type.struct_def)->super_Definition);
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"start_vector_of","");
        paVar3 = &local_340.field_2;
        Namer::Method(&local_340,&this_00->super_Namer,&local_360,&local_238);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_340,0,(char *)0x0,0x3847d9);
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_3a0.field_2._M_allocated_capacity = *psVar10;
          local_3a0.field_2._8_8_ = plVar8[3];
          local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        }
        else {
          local_3a0.field_2._M_allocated_capacity = *psVar10;
          local_3a0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_3a0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_3a0);
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_1b0.field_2._M_allocated_capacity = *psVar10;
          local_1b0.field_2._8_8_ = plVar8[3];
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        }
        else {
          local_1b0.field_2._M_allocated_capacity = *psVar10;
          local_1b0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_1b0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        CodeWriter::operator+=(this_01,&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != paVar3) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        piVar4 = &(this->code_).cur_ident_lvl_;
        *piVar4 = *piVar4 + 1;
        std::operator+(&local_360,"builder.startVector(size * MemoryLayout<",&local_3c0);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_360);
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_340.field_2._M_allocated_capacity = *psVar10;
          local_340.field_2._8_8_ = plVar8[3];
          local_340._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_340.field_2._M_allocated_capacity = *psVar10;
          local_340._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_340._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_340,(ulong)local_3c0._M_dataplus._M_p);
        puVar11 = (ulong *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar11) {
          local_3a0.field_2._M_allocated_capacity = *puVar11;
          local_3a0.field_2._8_8_ = plVar8[3];
          local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        }
        else {
          local_3a0.field_2._M_allocated_capacity = *puVar11;
          local_3a0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_3a0._M_string_length = plVar8[1];
        *plVar8 = (long)puVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_3a0);
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_1d0.field_2._M_allocated_capacity = *psVar10;
          local_1d0.field_2._8_8_ = plVar8[3];
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *psVar10;
          local_1d0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_1d0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        CodeWriter::operator+=(this_01,&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
          operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != paVar3) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        iVar6 = (this->code_).cur_ident_lvl_;
        if (iVar6 != 0) {
          (this->code_).cur_ident_lvl_ = iVar6 + -1;
        }
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"}","");
        CodeWriter::operator+=(this_01,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        uVar16 = local_3c0.field_2._M_allocated_capacity;
        _Var17._M_p = local_3c0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) goto LAB_002f5808;
      }
      goto LAB_002f5810;
    }
    paVar2 = &local_3c0.field_2;
    local_3c0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3c0,local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p + local_278._M_string_length);
    std::__cxx11::string::append((char *)&local_3c0);
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_3c0,(ulong)local_258._M_dataplus._M_p);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_380.field_2._M_allocated_capacity = *psVar10;
      local_380.field_2._8_8_ = plVar8[3];
      local_380._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_380.field_2._M_allocated_capacity = *psVar10;
      local_380._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_380._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_380);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_170.field_2._M_allocated_capacity = *psVar10;
      local_170.field_2._8_8_ = plVar8[3];
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar10;
      local_170._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_170._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    CodeWriter::operator+=(this_01,&local_170);
    this_02 = local_2c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,local_238._M_dataplus._M_p,
               local_238._M_dataplus._M_p + local_238._M_string_length);
    std::__cxx11::string::append((char *)&local_3a0);
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_278._M_dataplus._M_p);
    psVar10 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_3c0.field_2._M_allocated_capacity = *psVar10;
      local_3c0.field_2._8_8_ = puVar9[3];
      local_3c0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_3c0.field_2._M_allocated_capacity = *psVar10;
      local_3c0._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_3c0._M_string_length = puVar9[1];
    *puVar9 = psVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_3c0);
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    puVar11 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_380.field_2._M_allocated_capacity = *puVar11;
      local_380.field_2._8_8_ = plVar8[3];
    }
    else {
      local_380.field_2._M_allocated_capacity = *puVar11;
      local_380._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_380._M_string_length = plVar8[1];
    *plVar8 = (long)puVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_02,&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    uVar16 = local_3a0.field_2._M_allocated_capacity;
    _Var17._M_p = local_3a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p == &local_3a0.field_2) goto LAB_002f582c;
  }
  else {
    bVar18 = (field->value).type.enum_def != (EnumDef *)0x0;
    pcVar14 = "";
    if (uVar1 < 10 && bVar18) {
      pcVar14 = ".rawValue";
    }
    local_380._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_380,pcVar14,pcVar14 + (ulong)(uVar1 < 10 && bVar18) * 9);
    if (((field->value).type.enum_def == (EnumDef *)0x0) ||
       (9 < (field->value).type.base_type - BASE_TYPE_UTYPE)) {
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"");
    }
    else {
      std::operator+(&local_3c0,"?",&local_380);
    }
    std::operator+(&local_3a0,"{{VALUETYPE}}",&local_258);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_3a0);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_110.field_2._M_allocated_capacity = *psVar10;
      local_110.field_2._8_8_ = plVar8[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar10;
      local_110._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_110._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    CodeWriter::operator+=(this_01,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_2b8.field_2;
    local_2b8._M_dataplus._M_p = (pointer)paVar3;
    if (field->presence == kOptional) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,local_3c0._M_dataplus._M_p,
                 local_3c0._M_dataplus._M_p + local_3c0._M_string_length);
      std::__cxx11::string::append((char *)&local_2b8);
    }
    else {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,local_380._M_dataplus._M_p,
                 local_380._M_dataplus._M_p + local_380._M_string_length);
      std::__cxx11::string::append((char *)&local_2b8);
    }
    CodeWriter::operator+=(this_01,&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != paVar3) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,", at: {{TABLEOFFSET}}.{{OFFSET}}.p) }","");
    CodeWriter::operator+=(this_01,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (((field->value).type.enum_def == (EnumDef *)0x0) ||
       (9 < (field->value).type.base_type - BASE_TYPE_UTYPE)) {
      SwiftConstant_abi_cxx11_(&local_3a0,this,field);
    }
    else if (field->presence == kOptional) {
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"nil","");
    }
    else {
      GenEnumDefaultValue_abi_cxx11_(&local_3a0,this,field);
    }
    std::operator+(&local_50,"",&local_218);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_120 = *plVar12;
      lStack_118 = plVar8[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar12;
      local_130 = (long *)*plVar8;
    }
    local_128 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_298[0]);
    puVar11 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar11) {
      local_2d0 = *puVar11;
      lStack_2c8 = plVar8[3];
      local_2e0 = &local_2d0;
    }
    else {
      local_2d0 = *puVar11;
      local_2e0 = (ulong *)*plVar8;
    }
    local_2d8 = plVar8[1];
    *plVar8 = (long)puVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
    psVar10 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_360.field_2._M_allocated_capacity = *psVar10;
      local_360.field_2._8_8_ = puVar9[3];
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    }
    else {
      local_360.field_2._M_allocated_capacity = *psVar10;
      local_360._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_360._M_string_length = puVar9[1];
    *puVar9 = psVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_1f8[0] = local_1e8;
    if (field->presence == kOptional) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"nil","");
    }
    else {
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1f8,local_3a0._M_dataplus._M_p,
                 local_3a0._M_dataplus._M_p + local_3a0._M_string_length);
    }
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_1f8[0]);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_340.field_2._M_allocated_capacity = *psVar10;
      local_340.field_2._8_8_ = plVar8[3];
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    }
    else {
      local_340.field_2._M_allocated_capacity = *psVar10;
      local_340._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_340._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_2c0,&local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8[0] != local_1e8) {
      operator_delete(local_1f8[0],local_1e8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    uVar16 = local_3c0.field_2._M_allocated_capacity;
    _Var17._M_p = local_3c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
LAB_002f5808:
      operator_delete(_Var17._M_p,uVar16 + 1);
    }
LAB_002f5810:
    uVar16 = local_380.field_2._M_allocated_capacity;
    _Var17._M_p = local_380._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p == &local_380.field_2) goto LAB_002f582c;
  }
  operator_delete(_Var17._M_p,uVar16 + 1);
LAB_002f582c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenTableWriterFields(const FieldDef &field,
                            std::vector<std::string> *create_body,
                            std::vector<std::string> *create_header) {
    std::string builder_string = ", _ fbb: inout FlatBufferBuilder) { ";
    auto &create_func_body = *create_body;
    auto &create_func_header = *create_header;
    const auto field_field = namer_.Field(field);
    const auto field_var = namer_.Variable(field);
    const auto type = GenType(field.value.type);
    const auto opt_scalar =
        field.IsOptional() && IsScalar(field.value.type.base_type);
    const auto nullable_type = opt_scalar ? type + "?" : type;
    code_.SetValue("FIELDVAR", namer_.Variable(field));
    code_.SetValue("VALUETYPE", nullable_type);
    code_.SetValue("OFFSET", namer_.Field(field));
    code_.SetValue("CONSTANT", SwiftConstant(field));
    std::string check_if_vector =
        (IsVector(field.value.type) || IsArray(field.value.type)) ? "VectorOf("
                                                                  : "(";
    const auto body = "add" + check_if_vector + field_field + ": ";
    code_ += "{{ACCESS_TYPE}} static func " + body + "\\";

    create_func_body.push_back("{{STRUCTNAME}}." + body + field_field +
                               ", &fbb)");

    if (IsScalar(field.value.type.base_type) &&
        !IsBool(field.value.type.base_type)) {
      const std::string is_enum = IsEnum(field.value.type) ? ".rawValue" : "";
      const std::string optional_enum =
          IsEnum(field.value.type) ? ("?" + is_enum) : "";
      code_ +=
          "{{VALUETYPE}}" + builder_string + "fbb.add(element: {{FIELDVAR}}\\";

      code_ += field.IsOptional() ? (optional_enum + "\\")
                                  : (is_enum + ", def: {{CONSTANT}}\\");

      code_ += ", at: {{TABLEOFFSET}}.{{OFFSET}}.p) }";

      const auto default_value =
          IsEnum(field.value.type)
              ? (field.IsOptional() ? "nil" : GenEnumDefaultValue(field))
              : SwiftConstant(field);
      create_func_header.push_back(
          "" + field_field + ": " + nullable_type + " = " +
          (field.IsOptional() ? "nil" : default_value));
      return;
    }

    if (IsBool(field.value.type.base_type)) {
      std::string default_value = SwiftConstant(field);

      code_.SetValue("CONSTANT", default_value);
      code_.SetValue("VALUETYPE", field.IsOptional() ? "Bool?" : "Bool");
      code_ +=
          "{{VALUETYPE}}" + builder_string + "fbb.add(element: {{FIELDVAR}},\\";
      code_ += field.IsOptional() ? "\\" : " def: {{CONSTANT}},";
      code_ += " at: {{TABLEOFFSET}}.{{OFFSET}}.p) }";
      create_func_header.push_back(
          field_var + ": " + nullable_type + " = " +
          (field.IsOptional() ? "nil" : default_value));
      return;
    }

    if (IsStruct(field.value.type)) {
      const auto create_struct =
          "guard let {{FIELDVAR}} = {{FIELDVAR}} else { return };"
          " fbb.create(struct: {{FIELDVAR}}, position: "
          "{{TABLEOFFSET}}.{{OFFSET}}.p) }";
      code_ += type + "?" + builder_string + create_struct;
      /// Optional hard coded since structs are always optional
      create_func_header.push_back(field_var + ": " + type +
                                   (field.IsOptional() ? "? = nil" : ""));
      return;
    }

    const auto arg_label =
        namer_.Variable(field) +
        (IsVector(field.value.type) || IsArray(field.value.type)
             ? "VectorOffset"
             : "Offset");
    create_func_header.push_back(arg_label + " " + field_var + ": " + "Offset" +
                                 (field.IsRequired() ? "" : " = Offset()"));
    const auto reader_type =
        IsStruct(field.value.type) && field.value.type.struct_def->fixed
            ? "structOffset: {{TABLEOFFSET}}.{{OFFSET}}.p) }"
            : "offset: {{FIELDVAR}}, at: {{TABLEOFFSET}}.{{OFFSET}}.p) }";
    code_ += "Offset" + builder_string + "fbb.add(" + reader_type;

    const auto vectortype = field.value.type.VectorType();

    if ((vectortype.base_type == BASE_TYPE_STRUCT &&
         field.value.type.struct_def->fixed) &&
        (IsVector(field.value.type) || IsArray(field.value.type))) {
      const auto field_name = namer_.NamespacedType(*vectortype.struct_def);
      code_ += "{{ACCESS_TYPE}} static func " +
               namer_.Method("start_vector_of", field_var) +
               "(_ size: Int, in builder: inout "
               "FlatBufferBuilder) {";
      Indent();
      code_ += "builder.startVector(size * MemoryLayout<" + field_name +
               ">.size, elementSize: MemoryLayout<" + field_name +
               ">.alignment)";
      Outdent();
      code_ += "}";
    }
  }